

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O1

bool __thiscall duckdb::WindowNaiveState::KeyEqual(WindowNaiveState *this,idx_t *lidx,idx_t *ridx)

{
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_00;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  pointer pWVar4;
  pointer pWVar5;
  pointer this_01;
  reference pvVar6;
  idx_t iVar7;
  size_type __n;
  ulong seek_idx;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var8;
  bool bVar9;
  bool bVar10;
  sel_t f;
  sel_t r;
  sel_t l;
  SelectionVector fsel;
  SelectionVector rsel;
  SelectionVector lsel;
  Vector right;
  Vector left;
  undefined4 local_15c;
  sel_t local_158;
  sel_t local_154;
  undefined4 *local_150;
  undefined8 local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  SelectionVector local_138;
  SelectionVector local_120;
  DataChunk *local_108;
  Vector local_100;
  Vector local_98;
  
  uVar1 = *lidx;
  iVar7 = *ridx;
  this_00 = &(this->super_WindowAggregatorLocalState).cursor;
  pWVar4 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  uVar2 = (pWVar4->state).next_row_index;
  bVar10 = uVar1 < (pWVar4->state).current_row_index;
  pWVar4 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  pWVar5 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  seek_idx = uVar1;
  if (uVar1 < uVar2 && !bVar10) {
    seek_idx = iVar7;
  }
  iVar3 = (int)uVar1;
  if (uVar2 <= uVar1 || bVar10) {
    iVar3 = (int)iVar7;
  }
  local_154 = iVar3 - (int)(pWVar5->state).current_row_index;
  local_120.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_120.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_120.sel_vector = &local_154;
  _Var8._M_head_impl =
       (this_00->super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
       super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
  pWVar5 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  if ((((pWVar5->state).next_row_index <= seek_idx) ||
      (seek_idx < (pWVar5->state).current_row_index)) &&
     ((_Var8._M_head_impl =
            (this->comparer).
            super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
            super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
            .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl,
      *(idx_t *)((long)&(_Var8._M_head_impl)->state + 0x58) <= seek_idx ||
      (seek_idx < *(idx_t *)((long)&(_Var8._M_head_impl)->state + 0x50))))) {
    this_01 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->(&(_Var8._M_head_impl)->paged->inputs);
    ColumnDataCollection::Seek
              (this_01,seek_idx,&(_Var8._M_head_impl)->state,&(_Var8._M_head_impl)->chunk);
  }
  local_158 = (int)seek_idx - (int)((_Var8._M_head_impl)->state).current_row_index;
  local_138.sel_vector = &local_158;
  local_138.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148 = 0;
  local_15c = 0;
  local_150 = &local_15c;
  bVar10 = (pWVar4->chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (pWVar4->chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (!bVar10) {
    local_108 = &(_Var8._M_head_impl)->chunk;
    __n = 0;
    do {
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&(pWVar4->chunk).data,__n);
      Vector::Vector(&local_98,pvVar6,&local_120,1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&local_108->data,__n);
      Vector::Vector(&local_100,pvVar6,&local_138,1);
      iVar7 = VectorOperations::NotDistinctFrom
                        (&local_98,&local_100,(optional_ptr<const_duckdb::SelectionVector,_true>)0x0
                         ,1,(optional_ptr<duckdb::SelectionVector,_true>)0x0,
                         (SelectionVector *)&local_150);
      if (local_100.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_100.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType(&local_100.type);
      if (local_98.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_98.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType(&local_98.type);
      if (iVar7 == 0) break;
      __n = __n + 1;
      bVar9 = __n < (ulong)(((long)(pWVar4->chunk).data.
                                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pWVar4->chunk).data.
                                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           0x4ec4ec4ec4ec4ec5);
      bVar10 = !bVar9;
    } while (bVar9);
  }
  if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
  }
  if (local_138.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_120.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return bVar10;
}

Assistant:

bool WindowNaiveState::KeyEqual(const idx_t &lidx, const idx_t &ridx) {
	//	One of the indices will be scanned, so make it the left one
	auto lhs = lidx;
	auto rhs = ridx;
	if (!cursor->RowIsVisible(lhs)) {
		std::swap(lhs, rhs);
		D_ASSERT(cursor->RowIsVisible(lhs));
	}

	auto &scanned = cursor->chunk;
	auto l = cursor->RowOffset(lhs);
	SelectionVector lsel(&l);

	auto rreader = cursor.get();
	if (!cursor->RowIsVisible(rhs)) {
		//	Values on different pages!
		rreader = comparer.get();
		rreader->Seek(rhs);
	}
	auto rscanned = &rreader->chunk;
	auto r = rreader->RowOffset(rhs);
	SelectionVector rsel(&r);

	sel_t f = 0;
	SelectionVector fsel(&f);

	for (column_t c = 0; c < scanned.ColumnCount(); ++c) {
		Vector left(scanned.data[c], lsel, 1);
		Vector right(rscanned->data[c], rsel, 1);
		if (!VectorOperations::NotDistinctFrom(left, right, nullptr, 1, nullptr, &fsel)) {
			return false;
		}
	}

	return true;
}